

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Impl *this_00;
  uint64_t id_00;
  bool bVar1;
  Which WVar2;
  RawSchema *value;
  char (*in_R8) [2];
  anon_class_1_0_00000001 local_109;
  String local_108;
  ArrayPtr<const_char> local_f0;
  anon_class_1_0_00000001 local_dd [13];
  ArrayPtr<const_char> local_d0;
  uint local_c0;
  uint local_bc;
  Fault local_b8;
  Fault f;
  undefined1 local_a8 [8];
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> _kjCondition;
  Reader node;
  RawSchema *existing;
  uint64_t uStack_30;
  Which expectedKind_local;
  uint64_t id_local;
  Validator *this_local;
  
  existing._6_2_ = expectedKind;
  uStack_30 = id;
  id_local = (uint64_t)this;
  SchemaLoader::Impl::tryGet((Impl *)&node._reader.nestingLimit,(uint64_t)this->loader);
  id_00 = uStack_30;
  if (node._reader._40_8_ == 0) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              (&local_108,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x2dc3b8,in_R8);
    kj::StringPtr::StringPtr((StringPtr *)&local_f0,&local_108);
    value = SchemaLoader::Impl::loadEmpty(this_00,id_00,(StringPtr)local_f0,existing._6_2_,true);
    kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
    upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>
              ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,id_00,value,
               &local_109);
    kj::String::~String(&local_108);
  }
  else {
    readMessageUnchecked<capnp::schema::Node>
              ((Reader *)&_kjCondition.result,*(word **)(node._reader._40_8_ + 8));
    f.exception._4_2_ = capnp::schema::Node::Reader::which((Reader *)&_kjCondition.result);
    f.exception._6_2_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Which *)((long)&f.exception + 4));
    kj::_::DebugExpression<capnp::schema::Node::Which>::operator==
              ((DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *)local_a8
               ,(DebugExpression<capnp::schema::Node::Which> *)((long)&f.exception + 6),
               (Which *)((long)&existing + 6));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
    if (bVar1) {
      kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
      upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>
                ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,uStack_30,
                 (RawSchema *)node._reader._40_8_,local_dd);
    }
    else {
      local_bc = (uint)existing._6_2_;
      WVar2 = capnp::schema::Node::Reader::which((Reader *)&_kjCondition.result);
      local_c0 = (uint)WVar2;
      local_d0 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)&_kjCondition.result);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
                (&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x260,FAILED,"node.which() == expectedKind",
                 "_kjCondition,\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
                 ,(DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *)
                  local_a8,(char (*) [46])"expected a different kind of node for this ID",
                 &stack0xffffffffffffffd0,&local_bc,&local_c0,(Reader *)&local_d0);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_b8);
    }
  }
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }